

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O2

void __thiscall
charls::jpeg_stream_reader::read_define_restart_interval_segment(jpeg_stream_reader *this)

{
  size_t sVar1;
  uint16_t uVar2;
  uint uVar3;
  
  sVar1 = (this->segment_data_).size_;
  if (sVar1 == 4) {
    uVar3 = read_uint32(this);
  }
  else if (sVar1 == 3) {
    uVar3 = read_uint24(this);
  }
  else {
    if (sVar1 != 2) {
      impl::throw_jpegls_error(invalid_marker_segment_size);
    }
    uVar2 = read_uint16(this);
    uVar3 = (uint)uVar2;
  }
  (this->parameters_).restart_interval = uVar3;
  return;
}

Assistant:

void jpeg_stream_reader::read_define_restart_interval_segment()
{
    // Note: The JPEG-LS standard supports a 2,3 or 4 byte restart interval (see ISO/IEC 14495-1, C.2.5)
    //       The original JPEG standard only supports 2 bytes (16 bit big endian).
    switch (segment_data_.size())
    {
    case 2:
        parameters_.restart_interval = read_uint16();
        break;

    case 3:
        parameters_.restart_interval = read_uint24();
        break;

    case 4:
        parameters_.restart_interval = read_uint32();
        break;

    default:
        throw_jpegls_error(jpegls_errc::invalid_marker_segment_size);
    }
}